

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

size_t write_module(MIR_context_t ctx,writer_func_t writer,MIR_module_t_conflict module)

{
  size_t sVar1;
  size_t sVar2;
  MIR_item_t_conflict local_30;
  MIR_item_t_conflict item;
  size_t len;
  MIR_module_t_conflict module_local;
  writer_func_t writer_local;
  MIR_context_t ctx_local;
  
  sVar1 = write_name(ctx,writer,"module");
  sVar2 = write_name(ctx,writer,module->name);
  item = (MIR_item_t_conflict)(sVar2 + sVar1);
  for (local_30 = DLIST_MIR_item_t_head(&module->items); local_30 != (MIR_item_t_conflict)0x0;
      local_30 = DLIST_MIR_item_t_next(local_30)) {
    sVar1 = write_item(ctx,writer,local_30);
    item = (MIR_item_t_conflict)((long)&item->data + sVar1);
  }
  sVar1 = write_name(ctx,writer,"endmodule");
  return (long)&item->data + sVar1;
}

Assistant:

static size_t write_module (MIR_context_t ctx, writer_func_t writer, MIR_module_t module) {
  size_t len = write_name (ctx, writer, "module");

  len += write_name (ctx, writer, module->name);
  for (MIR_item_t item = DLIST_HEAD (MIR_item_t, module->items); item != NULL;
       item = DLIST_NEXT (MIR_item_t, item))
    len += write_item (ctx, writer, item);
  len += write_name (ctx, writer, "endmodule");
  return len;
}